

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_eval_xpath4(lyd_node *ctx_node,lyd_node *tree,lys_module *cur_mod,char *xpath,
                      LY_VALUE_FORMAT format,void *prefix_data,lyxp_var *vars,
                      LY_XPATH_TYPE *ret_type,ly_set **node_set,char **string,longdouble *number,
                      ly_bool *boolean)

{
  LY_ERR LVar1;
  uint32_t uVar2;
  lyd_node **pplVar3;
  lys_module *plVar4;
  char *pcVar5;
  LY_ERR err;
  ly_ctx *ctx;
  long lVar6;
  ulong uVar7;
  lyxp_expr *exp;
  LY_VALUE_FORMAT local_cc;
  lyxp_set xp_set;
  
  memset(&xp_set,0,0x90);
  exp = (lyxp_expr *)0x0;
  if (tree == (lyd_node *)0x0) {
    pcVar5 = "tree";
LAB_0012429b:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lyd_eval_xpath4");
    return LY_EINVAL;
  }
  if (xpath == (char *)0x0) {
    pcVar5 = "xpath";
    goto LAB_0012429b;
  }
  if (((((number == (longdouble *)0x0 || string == (char **)0x0) ||
        (node_set == (ly_set **)0x0 || ret_type == (LY_XPATH_TYPE *)0x0)) ||
        boolean == (ly_bool *)0x0) &&
      (((string != (char **)0x0 || number != (longdouble *)0x0) || boolean != (ly_bool *)0x0) ||
       node_set == (ly_set **)0x0)) &&
     (((node_set != (ly_set **)0x0 || number != (longdouble *)0x0) || boolean != (ly_bool *)0x0) ||
      string == (char **)0x0)) {
    if ((!(bool)(~(number == (longdouble *)0x0 ||
                  (node_set != (ly_set **)0x0 || string != (char **)0x0)) &
                boolean == (ly_bool *)0x0)) &&
       ((boolean == (ly_bool *)0x0 ||
        ((node_set != (ly_set **)0x0 || string != (char **)0x0) || number != (longdouble *)0x0)))) {
      pcVar5 = 
      "((ret_type && node_set && string && number && boolean) || (node_set && !string && !number && !boolean) || (!node_set && string && !number && !boolean) || (!node_set && !string && number && !boolean) || (!node_set && !string && !number && boolean))"
      ;
      goto LAB_0012429b;
    }
  }
  if (tree->schema == (lysc_node *)0x0) {
    plVar4 = (lys_module *)&tree[2].schema;
  }
  else {
    plVar4 = tree->schema->module;
  }
  local_cc = format;
  LVar1 = lyxp_expr_parse(plVar4->ctx,xpath,0,'\x01',&exp);
  if (LVar1 != LY_SUCCESS) goto LAB_00124328;
  if (tree->schema == (lysc_node *)0x0) {
    plVar4 = (lys_module *)&tree[2].schema;
  }
  else {
    plVar4 = tree->schema->module;
  }
  LVar1 = lyxp_eval(plVar4->ctx,exp,cur_mod,local_cc,prefix_data,ctx_node,ctx_node,tree,vars,&xp_set
                    ,1);
  if (LVar1 != LY_SUCCESS) goto LAB_00124328;
  if (node_set != (ly_set **)0x0) {
    if (xp_set.type == LYXP_SET_NODE_SET) {
      LVar1 = ly_set_new(node_set);
      if (LVar1 != LY_SUCCESS) goto LAB_00124328;
      pplVar3 = (lyd_node **)malloc((ulong)xp_set.used << 3);
      ((*node_set)->field_2).dnodes = pplVar3;
      if (((*node_set)->field_2).dnodes != (lyd_node **)0x0) {
        (*node_set)->size = xp_set.used;
        if (xp_set.used != 0) {
          lVar6 = 8;
          uVar7 = 0;
          uVar2 = xp_set.used;
          do {
            if ((*(int *)(CONCAT71(xp_set.val._1_7_,xp_set.val.bln) + lVar6) == 3) &&
               (LVar1 = ly_set_add(*node_set,
                                   *(void **)(CONCAT71(xp_set.val._1_7_,xp_set.val.bln) + -8 + lVar6
                                             ),'\x01',(uint32_t *)0x0), uVar2 = xp_set.used,
               LVar1 != LY_SUCCESS)) goto LAB_00124328;
            uVar7 = uVar7 + 1;
            lVar6 = lVar6 + 0x10;
          } while (uVar7 < uVar2);
        }
        if (ret_type != (LY_XPATH_TYPE *)0x0) {
          *ret_type = LY_XPATH_NODE_SET;
        }
        goto LAB_001243a4;
      }
      if (tree->schema == (lysc_node *)0x0) {
        plVar4 = (lys_module *)&tree[2].schema;
      }
      else {
        plVar4 = tree->schema->module;
      }
      ctx = plVar4->ctx;
      pcVar5 = "Memory allocation failed (%s()).";
      xpath = "lyd_eval_xpath4";
      LVar1 = LY_EMEM;
      err = LY_EMEM;
    }
    else {
      if ((string != (char **)0x0 || number != (longdouble *)0x0) || boolean != (ly_bool *)0x0)
      goto LAB_001243a4;
      if (tree->schema == (lysc_node *)0x0) {
        plVar4 = (lys_module *)&tree[2].schema;
      }
      else {
        plVar4 = tree->schema->module;
      }
      ctx = plVar4->ctx;
      pcVar5 = "XPath \"%s\" result is not a node set.";
      LVar1 = LY_EINVAL;
      err = LY_EINVAL;
    }
    ly_log(ctx,LY_LLERR,err,pcVar5,xpath);
    goto LAB_00124328;
  }
LAB_001243a4:
  if (string != (char **)0x0) {
    if ((xp_set.type != LYXP_SET_STRING && node_set == (ly_set **)0x0) &&
       (LVar1 = lyxp_set_cast(&xp_set,LYXP_SET_STRING), LVar1 != LY_SUCCESS)) goto LAB_00124328;
    if (xp_set.type == LYXP_SET_STRING) {
      *string = (char *)CONCAT71(xp_set.val._1_7_,xp_set.val.bln);
      xp_set.val.bln = '\0';
      xp_set.val._1_7_ = 0;
      if (ret_type != (LY_XPATH_TYPE *)0x0) {
        *ret_type = LY_XPATH_STRING;
      }
    }
  }
  if (number != (longdouble *)0x0) {
    if ((xp_set.type != LYXP_SET_NUMBER && node_set == (ly_set **)0x0) &&
       (LVar1 = lyxp_set_cast(&xp_set,LYXP_SET_NUMBER), LVar1 != LY_SUCCESS)) goto LAB_00124328;
    if ((xp_set.type == LYXP_SET_NUMBER) &&
       (*number = (longdouble)CONCAT28(xp_set.val._8_2_,CONCAT71(xp_set.val._1_7_,xp_set.val.bln)),
       ret_type != (LY_XPATH_TYPE *)0x0)) {
      *ret_type = LY_XPATH_NUMBER;
    }
  }
  if (boolean != (ly_bool *)0x0) {
    if (xp_set.type == LYXP_SET_BOOLEAN || node_set != (ly_set **)0x0) {
      if (xp_set.type != LYXP_SET_BOOLEAN) goto LAB_001245f1;
    }
    else {
      LVar1 = lyxp_set_cast(&xp_set,LYXP_SET_BOOLEAN);
      if ((LVar1 != LY_SUCCESS) || (xp_set.type != LYXP_SET_BOOLEAN)) goto LAB_00124328;
    }
    *boolean = xp_set.val.bln;
    if (ret_type != (LY_XPATH_TYPE *)0x0) {
      *ret_type = LY_XPATH_BOOLEAN;
    }
  }
LAB_001245f1:
  LVar1 = LY_SUCCESS;
LAB_00124328:
  lyxp_set_free_content(&xp_set);
  if (tree->schema == (lysc_node *)0x0) {
    plVar4 = (lys_module *)&tree[2].schema;
  }
  else {
    plVar4 = tree->schema->module;
  }
  lyxp_expr_free(plVar4->ctx,exp);
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_eval_xpath4(const struct lyd_node *ctx_node, const struct lyd_node *tree, const struct lys_module *cur_mod,
        const char *xpath, LY_VALUE_FORMAT format, void *prefix_data, const struct lyxp_var *vars, LY_XPATH_TYPE *ret_type,
        struct ly_set **node_set, char **string, long double *number, ly_bool *boolean)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_set xp_set = {0};
    struct lyxp_expr *exp = NULL;
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, tree, xpath, ((ret_type && node_set && string && number && boolean) ||
            (node_set && !string && !number && !boolean) || (!node_set && string && !number && !boolean) ||
            (!node_set && !string && number && !boolean) || (!node_set && !string && !number && boolean)), LY_EINVAL);

    /* parse expression */
    ret = lyxp_expr_parse((struct ly_ctx *)LYD_CTX(tree), xpath, 0, 1, &exp);
    LY_CHECK_GOTO(ret, cleanup);

    /* evaluate expression */
    ret = lyxp_eval(LYD_CTX(tree), exp, cur_mod, format, prefix_data, ctx_node, ctx_node, tree, vars, &xp_set,
            LYXP_IGNORE_WHEN);
    LY_CHECK_GOTO(ret, cleanup);

    /* return expected result type without or with casting */
    if (node_set) {
        /* node set */
        if (xp_set.type == LYXP_SET_NODE_SET) {
            /* transform into a set */
            LY_CHECK_GOTO(ret = ly_set_new(node_set), cleanup);
            (*node_set)->objs = malloc(xp_set.used * sizeof *(*node_set)->objs);
            LY_CHECK_ERR_GOTO(!(*node_set)->objs, LOGMEM(LYD_CTX(tree)); ret = LY_EMEM, cleanup);
            (*node_set)->size = xp_set.used;
            for (i = 0; i < xp_set.used; ++i) {
                if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                    ret = ly_set_add(*node_set, xp_set.val.nodes[i].node, 1, NULL);
                    LY_CHECK_GOTO(ret, cleanup);
                }
            }
            if (ret_type) {
                *ret_type = LY_XPATH_NODE_SET;
            }
        } else if (!string && !number && !boolean) {
            LOGERR(LYD_CTX(tree), LY_EINVAL, "XPath \"%s\" result is not a node set.", xpath);
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    if (string) {
        if ((xp_set.type != LYXP_SET_STRING) && !node_set) {
            /* cast into string */
            LY_CHECK_GOTO(ret = lyxp_set_cast(&xp_set, LYXP_SET_STRING), cleanup);
        }
        if (xp_set.type == LYXP_SET_STRING) {
            /* string */
            *string = xp_set.val.str;
            xp_set.val.str = NULL;
            if (ret_type) {
                *ret_type = LY_XPATH_STRING;
            }
        }
    }

    if (number) {
        if ((xp_set.type != LYXP_SET_NUMBER) && !node_set) {
            /* cast into number */
            LY_CHECK_GOTO(ret = lyxp_set_cast(&xp_set, LYXP_SET_NUMBER), cleanup);
        }
        if (xp_set.type == LYXP_SET_NUMBER) {
            /* number */
            *number = xp_set.val.num;
            if (ret_type) {
                *ret_type = LY_XPATH_NUMBER;
            }
        }
    }

    if (boolean) {
        if ((xp_set.type != LYXP_SET_BOOLEAN) && !node_set) {
            /* cast into boolean */
            LY_CHECK_GOTO(ret = lyxp_set_cast(&xp_set, LYXP_SET_BOOLEAN), cleanup);
        }
        if (xp_set.type == LYXP_SET_BOOLEAN) {
            /* boolean */
            *boolean = xp_set.val.bln;
            if (ret_type) {
                *ret_type = LY_XPATH_BOOLEAN;
            }
        }
    }

cleanup:
    lyxp_set_free_content(&xp_set);
    lyxp_expr_free((struct ly_ctx *)LYD_CTX(tree), exp);
    return ret;
}